

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O1

void __thiscall
node::anon_unknown_2::ChainImpl::rpcRunLater
          (ChainImpl *this,string *name,function<void_()> fn,int64_t seconds)

{
  long lVar1;
  _Invoker_type p_Var2;
  _Manager_type p_Var3;
  function<void_()> func;
  long in_FS_OFFSET;
  undefined8 uVar4;
  undefined8 uVar5;
  _Manager_type p_Var6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = (void *)0x0;
  uVar5 = 0;
  p_Var2 = *(_Invoker_type *)(seconds + 0x18);
  p_Var3 = *(_Manager_type *)(seconds + 0x10);
  p_Var6 = (_Manager_type)0x0;
  if (p_Var3 != (_Manager_type)0x0) {
    uVar4 = *(undefined8 *)seconds;
    uVar5 = *(undefined8 *)(seconds + 8);
    *(undefined8 *)(seconds + 0x10) = 0;
    *(undefined8 *)(seconds + 0x18) = 0;
    p_Var6 = p_Var3;
  }
  func.super__Function_base._M_functor._8_8_ = uVar5;
  func.super__Function_base._M_functor._M_unused._M_object = (void *)uVar4;
  func.super__Function_base._M_manager = p_Var6;
  func._M_invoker = p_Var2;
  RPCRunLater(name,func,(int64_t)&stack0xffffffffffffffc8);
  if (p_Var6 != (_Manager_type)0x0) {
    (*p_Var6)((_Any_data *)&stack0xffffffffffffffc8,(_Any_data *)&stack0xffffffffffffffc8,
              __destroy_functor);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void rpcRunLater(const std::string& name, std::function<void()> fn, int64_t seconds) override
    {
        RPCRunLater(name, std::move(fn), seconds);
    }